

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,PropertyId propertyId,
               Var value)

{
  bool bVar1;
  
  if (propertyRecord != (PropertyRecord *)0x0) {
    bVar1 = CheckHeuristicsForFixedDataProps(instance,propertyRecord,value);
    return bVar1;
  }
  bVar1 = CheckHeuristicsForFixedDataProps(instance,propertyId,value);
  return bVar1;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, PropertyId propertyId, Var value)
    {
        if(propertyRecord)
        {
            return CheckHeuristicsForFixedDataProps(instance, propertyRecord, value);
        }
        else
        {
            return CheckHeuristicsForFixedDataProps(instance,propertyId,value);
        }
    }